

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O0

bool __thiscall
poplar::
compact_bonsai_trie<85U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::compare_dsp_(compact_bonsai_trie<85U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
               *this,uint64_t slot_id,uint64_t rhs)

{
  uint64_t uVar1;
  ulong in_RDX;
  uint64_t in_RDI;
  bool bVar2;
  uint64_t val;
  uint64_t lhs;
  compact_vector *in_stack_ffffffffffffffd0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar1 = compact_vector::operator[](in_stack_ffffffffffffffd0,in_RDI);
  if ((uVar1 & 0x1f) < 0x1f) {
    bVar2 = (uVar1 & 0x1f) == in_RDX;
  }
  else if (in_RDX < 0x1f) {
    bVar2 = false;
  }
  else {
    uVar1 = compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::get
                      ((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI);
    if (uVar1 == 0xffffffffffffffff) {
      if (in_RDX < 0x9e) {
        bVar2 = false;
      }
      else {
        uVar1 = standard_hash_table<80U,_poplar::hash::vigna_hasher>::get
                          ((standard_hash_table<80U,_poplar::hash::vigna_hasher> *)
                           0xffffffffffffffff,(uint64_t)in_stack_ffffffffffffffd0);
        bVar2 = uVar1 == in_RDX;
      }
    }
    else {
      bVar2 = uVar1 + 0x1f == in_RDX;
    }
  }
  return bVar2;
}

Assistant:

bool compare_dsp_(uint64_t slot_id, uint64_t rhs) const {
        uint64_t lhs = table_[slot_id] & dsp1_mask;
        if (lhs < dsp1_mask) {
            return lhs == rhs;
        }
        if (rhs < dsp1_mask) {
            return false;
        }

        lhs = aux_cht_.get(slot_id);
        if (lhs != aux_cht_type::nil) {
            return lhs + dsp1_mask == rhs;
        }
        if (rhs < dsp1_mask + dsp2_mask) {
            return false;
        }

        auto val = aux_map_.get(slot_id);
        assert(val != aux_map_type::nil);
        return val == rhs;
    }